

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O0

void __thiscall ON_3dPoint::ON_3dPoint(ON_3dPoint *this,ON_4dPoint *p)

{
  double local_30;
  double w;
  ON_4dPoint *p_local;
  ON_3dPoint *this_local;
  
  this->x = p->x;
  this->y = p->y;
  this->z = p->z;
  if (((p->w == 1.0) && (!NAN(p->w))) || ((p->w == 0.0 && (!NAN(p->w))))) {
    local_30 = 1.0;
  }
  else {
    local_30 = 1.0 / p->w;
  }
  this->x = local_30 * this->x;
  this->y = local_30 * this->y;
  this->z = local_30 * this->z;
  return;
}

Assistant:

ON_3dPoint::ON_3dPoint(const ON_4dPoint& p)
{
  x=p.x;y=p.y;z=p.z;
  const double w = (p.w != 1.0 && p.w != 0.0) ? 1.0/p.w : 1.0;
  x *= w;
  y *= w;
  z *= w;
}